

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O2

void Acec_TreeFindTrees_rec
               (Vec_Int_t *vAdds,Vec_Int_t *vMap,int iObj,int Rank,Vec_Int_t *vTree,
               Vec_Bit_t *vFound)

{
  int iVar1;
  uint iAdd;
  uint iAdd_00;
  
  iVar1 = Abc_Var2Lit(iObj,1);
  iAdd = Vec_IntEntry(vMap,iVar1);
  iVar1 = Abc_Var2Lit(iObj,0);
  iAdd_00 = Vec_IntEntry(vMap,iVar1);
  if ((int)(iAdd | iAdd_00) < 0) {
    return;
  }
  iVar1 = Acec_TreeWhichPoint(vAdds,iAdd,iObj);
  Acec_TreeFindTrees2_rec(vAdds,vMap,iAdd,Rank - (uint)(iVar1 == 4),vTree,vFound);
  Acec_TreeFindTrees2_rec(vAdds,vMap,iAdd_00,Rank,vTree,vFound);
  return;
}

Assistant:

void Acec_TreeFindTrees_rec( Vec_Int_t * vAdds, Vec_Int_t * vMap, int iObj, int Rank, Vec_Int_t * vTree, Vec_Bit_t * vFound )
{
    int In  = Vec_IntEntry( vMap, Abc_Var2Lit(iObj, 1) );
    int Out = Vec_IntEntry( vMap, Abc_Var2Lit(iObj, 0) );
    if ( In < 0 || Out < 0 )
        return;
    Acec_TreeFindTrees2_rec( vAdds, vMap, In,  Acec_TreeWhichPoint(vAdds, In, iObj) == 4 ? Rank-1 : Rank, vTree, vFound );
    Acec_TreeFindTrees2_rec( vAdds, vMap, Out, Rank, vTree, vFound );
}